

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::
write_padded<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::str_writer<char>>
          (basic_writer<duckdb_fmt::v6::buffer_range<char>> *this,format_specs *specs,
          str_writer<char> *f)

{
  byte bVar1;
  size_t n;
  size_t sVar2;
  byte bVar3;
  char __tmp;
  size_t __len;
  size_t __n;
  size_t __len_1;
  checked_ptr<typename_buffer<char>::value_type> pcVar4;
  ulong uVar5;
  checked_ptr<typename_buffer<char>::value_type> local_38;
  
  uVar5 = (ulong)(uint)specs->width;
  n = f->size_;
  sVar2 = n;
  if (uVar5 != 0) {
    sVar2 = basic_writer<duckdb_fmt::v6::buffer_range<char>_>::str_writer<char>::width(f);
  }
  __n = uVar5 - sVar2;
  if (uVar5 < sVar2 || __n == 0) {
    local_38 = reserve<duckdb_fmt::v6::internal::buffer<char>,_0>
                         ((back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_> *)this,n);
    str_writer<char>::operator()((str_writer<char> *)f,&local_38);
  }
  else {
    local_38 = reserve<duckdb_fmt::v6::internal::buffer<char>,_0>
                         ((back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_> *)this,
                          (n + uVar5) - sVar2);
    bVar1 = (specs->fill).data_[0];
    bVar3 = specs->field_0x9 & 0xf;
    if (bVar3 == 3) {
      uVar5 = __n >> 1;
      pcVar4 = local_38;
      if (1 < __n) {
        pcVar4 = local_38 + uVar5;
        switchD_004a0b15::default(local_38,(uint)bVar1,uVar5);
      }
      local_38 = pcVar4;
      str_writer<char>::operator()((str_writer<char> *)f,&local_38);
      __n = __n - uVar5;
    }
    else {
      if (bVar3 == 2) {
        pcVar4 = local_38 + __n;
        switchD_004a0b15::default(local_38,(uint)bVar1,__n);
        local_38 = pcVar4;
        str_writer<char>::operator()((str_writer<char> *)f,&local_38);
        return;
      }
      str_writer<char>::operator()((str_writer<char> *)f,&local_38);
    }
    switchD_004a0b15::default(local_38,(uint)bVar1,__n);
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }